

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O2

bool send_notification(bgp_peer *peer,int8_t error,uint16_t error_sub)

{
  int iVar1;
  bgp_notification notification;
  
  notification.header.maker[0] = 0xff;
  notification.header.maker[1] = 0xff;
  notification.header.maker[2] = 0xff;
  notification.header.maker[3] = 0xff;
  notification.header.maker[4] = 0xff;
  notification.header.maker[5] = 0xff;
  notification.header.maker[6] = 0xff;
  notification.header.maker[7] = 0xff;
  notification.header.maker[8] = 0xff;
  notification.header.maker[9] = 0xff;
  notification.header.maker[10] = 0xff;
  notification.header.maker[0xb] = 0xff;
  notification.header.maker[0xc] = 0xff;
  notification.header.maker[0xd] = 0xff;
  notification.header.maker[0xe] = 0xff;
  notification.header.maker[0xf] = 0xff;
  notification.header.length = 0x1300;
  notification.header.type = '\x03';
  notification.error_sub = (uint8_t)(error_sub >> 8);
  notification.error = error;
  iVar1 = (**peer->_vptr_bgp_peer)(peer,&notification,0x13);
  return SUB41(iVar1,0);
}

Assistant:

bool send_notification(bgp_peer* peer, int8_t error, uint16_t error_sub){
    bgp_notification notification;
    memset(notification.header.maker, 0xff, 16);
    notification.header.length = htons(19);
    notification.header.type = NOTIFICATION;
    notification.error = error;
    notification.error_sub = htons(error_sub);
    return peer->send(&notification, 19);
}